

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,const_iterator first,
          const_iterator last)

{
  bool bVar1;
  MapValueRef *pMVar2;
  key_type *in_RDI;
  iterator exist_it;
  const_iterator it;
  const_pointer in_stack_ffffffffffffff98;
  const_iterator *a;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffb0;
  key_type *in_stack_ffffffffffffffb8;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffc0;
  
  a = (const_iterator *)&stack0x00000020;
  while (bVar1 = protobuf::operator!=(a,(const_iterator *)in_stack_ffffffffffffff98), bVar1) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
              ((const_iterator *)0x4421f1);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end(in_stack_ffffffffffffffc0);
    bVar1 = protobuf::operator==((iterator *)a,(iterator *)in_stack_ffffffffffffff98);
    if (bVar1) {
      in_stack_ffffffffffffff98 =
           Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                     ((const_iterator *)0x442231);
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                ((const_iterator *)0x44223f);
      pMVar2 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                         (in_stack_ffffffffffffffb0,in_RDI);
      pMVar2->data_ = (in_stack_ffffffffffffff98->second).data_;
      pMVar2->type_ = (in_stack_ffffffffffffff98->second).type_;
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator++(a);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }